

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void crec_finalizer(jit_State *J,TRef trcd,TRef trfin,cTValue *fin)

{
  ulong uVar1;
  TRef TVar2;
  void *ptr;
  
  uVar1 = fin->it64;
  if ((int)((long)uVar1 >> 0x2f) + 0xdU < 9) {
    if (trfin != 0) goto LAB_0015fec4;
    ptr = (void *)(uVar1 & 0x7fffffffffff);
  }
  else {
    if (uVar1 != 0xffffffffffffffff) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    ptr = (void *)0x0;
  }
  trfin = lj_ir_kptr_(J,IR_KPTR,ptr);
LAB_0015fec4:
  TVar2 = lj_ir_kint(J,(int)(fin->field_4).it >> 0xf);
  lj_ir_call(J,IRCALL_lj_cdata_setfin,trcd,(ulong)trfin,(ulong)TVar2);
  J->needsnap = '\x01';
  return;
}

Assistant:

static void crec_finalizer(jit_State *J, TRef trcd, TRef trfin, cTValue *fin)
{
  if (tvisgcv(fin)) {
    if (!trfin) trfin = lj_ir_kptr(J, gcval(fin));
  } else if (tvisnil(fin)) {
    trfin = lj_ir_kptr(J, NULL);
  } else {
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  lj_ir_call(J, IRCALL_lj_cdata_setfin, trcd,
	     trfin, lj_ir_kint(J, (int32_t)itype(fin)));
  J->needsnap = 1;
}